

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  SourceLineInfo *_lineInfo;
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  undefined4 uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  bool _missingAssertions;
  uint uVar7;
  undefined1 local_518 [8];
  SectionStats testCaseSectionStats;
  undefined1 auStack_278 [8];
  Counts assertions;
  undefined1 local_e0 [8];
  SectionInfo testCaseSection;
  long local_68 [2];
  size_t local_58;
  size_t local_50;
  size_t local_48;
  string *local_40;
  string *local_38;
  
  _name = this->m_activeTestCase;
  _lineInfo = &(_name->super_TestCaseInfo).lineInfo;
  local_38 = redirectedCout;
  SectionInfo::SectionInfo
            ((SectionInfo *)local_e0,_lineInfo,(string *)_name,
             &(_name->super_TestCaseInfo).description);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar2,(SectionInfo *)local_e0);
  local_48 = (this->m_totals).assertions.passed;
  local_50 = (this->m_totals).assertions.failed;
  local_58 = (this->m_totals).assertions.failedButOk;
  auStack_278 = (undefined1  [8])&assertions.failed;
  local_40 = redirectedCerr;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_278,"TEST_CASE","");
  testCaseSection.lineInfo.line = (size_t)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&testCaseSection.lineInfo.line,"");
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)local_518,(string *)auStack_278,_lineInfo,
             (string *)&testCaseSection.lineInfo.line,Normal);
  std::__cxx11::string::operator=((string *)&this->m_lastAssertionInfo,(string *)local_518);
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).lineInfo,
             (string *)testCaseSectionStats.sectionInfo.name.field_2._M_local_buf);
  (this->m_lastAssertionInfo).lineInfo.line =
       testCaseSectionStats.sectionInfo.description.field_2._M_allocated_capacity;
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).capturedExpression,
             (string *)(testCaseSectionStats.sectionInfo.description.field_2._M_local_buf + 8));
  (this->m_lastAssertionInfo).resultDisposition =
       testCaseSectionStats.sectionInfo.lineInfo.file.field_2._8_4_;
  if ((size_type *)testCaseSectionStats.sectionInfo.description.field_2._8_8_ !=
      &testCaseSectionStats.sectionInfo.lineInfo.file._M_string_length) {
    operator_delete((void *)testCaseSectionStats.sectionInfo.description.field_2._8_8_,
                    testCaseSectionStats.sectionInfo.lineInfo.file._M_string_length + 1);
  }
  if ((string *)testCaseSectionStats.sectionInfo.name.field_2._M_allocated_capacity !=
      &testCaseSectionStats.sectionInfo.description) {
    operator_delete((void *)testCaseSectionStats.sectionInfo.name.field_2._M_allocated_capacity,
                    (ulong)(testCaseSectionStats.sectionInfo.description._M_dataplus._M_p + 1));
  }
  if ((SectionInfo *)CONCAT44(local_518._4_4_,local_518._0_4_) != &testCaseSectionStats.sectionInfo)
  {
    operator_delete((undefined1 *)CONCAT44(local_518._4_4_,local_518._0_4_),
                    (ulong)(testCaseSectionStats.sectionInfo.name._M_dataplus._M_p + 1));
  }
  if ((long *)testCaseSection.lineInfo.line != local_68) {
    operator_delete((void *)testCaseSection.lineInfo.line,local_68[0] + 1);
  }
  if (auStack_278 != (undefined1  [8])&assertions.failed) {
    operator_delete((void *)auStack_278,assertions.failed + 1);
  }
  seedRng((this->m_config).m_p);
  gettimeofday((timeval *)local_518,(__timezone_ptr_t)0x0);
  iVar4 = (int)testCaseSectionStats._vptr_SectionStats;
  uVar3 = local_518._0_4_;
  uVar7 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar7 & 1) == 0) {
    invokeActiveTestCase(this);
  }
  else {
    StreamRedirect::StreamRedirect((StreamRedirect *)local_518,(ostream *)&std::cout,local_38);
    StreamRedirect::StreamRedirect((StreamRedirect *)auStack_278,(ostream *)&std::cerr,local_40);
    invokeActiveTestCase(this);
    StreamRedirect::~StreamRedirect((StreamRedirect *)auStack_278);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_518);
  }
  gettimeofday((timeval *)local_518,(__timezone_ptr_t)0x0);
  local_38 = (string *)
             ((double)(uint)(((int)testCaseSectionStats._vptr_SectionStats - iVar4) +
                            (local_518._0_4_ - uVar3) * 1000000) / 1000000.0);
  (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
    _vptr_NonCopyable[10])();
  handleUnfinishedSections(this);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  auStack_278 = (undefined1  [8])((this->m_totals).assertions.passed - local_48);
  assertions.passed = (this->m_totals).assertions.failed - local_50;
  assertions.failed = (this->m_totals).assertions.failedButOk - local_58;
  _missingAssertions = testForMissingAssertions(this,(Counts *)auStack_278);
  sVar6 = assertions.failed;
  sVar5 = assertions.passed;
  if (((_name->super_TestCaseInfo).properties & (MayFail|ShouldFail)) != None) {
    assertions.failed = assertions.passed;
    assertions.passed = sVar6;
    psVar1 = &(this->m_totals).assertions.failed;
    *psVar1 = *psVar1 - sVar5;
    psVar1 = &(this->m_totals).assertions.failedButOk;
    *psVar1 = *psVar1 + sVar5;
  }
  SectionStats::SectionStats
            ((SectionStats *)local_518,(SectionInfo *)local_e0,(Counts *)auStack_278,
             (double)local_38,_missingAssertions);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,local_518);
  SectionStats::~SectionStats((SectionStats *)local_518);
  if ((size_type *)testCaseSection.description.field_2._8_8_ !=
      &testCaseSection.lineInfo.file._M_string_length) {
    operator_delete((void *)testCaseSection.description.field_2._8_8_,
                    testCaseSection.lineInfo.file._M_string_length + 1);
  }
  if ((size_type *)testCaseSection.name.field_2._8_8_ !=
      &testCaseSection.description._M_string_length) {
    operator_delete((void *)testCaseSection.name.field_2._8_8_,
                    testCaseSection.description._M_string_length + 1);
  }
  if (local_e0 != (undefined1  [8])&testCaseSection.name._M_string_length) {
    operator_delete((void *)local_e0,testCaseSection.name._M_string_length + 1);
  }
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );

                seedRng( *m_config );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( Catch::cout(), redirectedCout );
                    StreamRedirect cerrRedir( Catch::cerr(), redirectedCerr );
                    invokeActiveTestCase();
                }
                else {
                    invokeActiveTestCase();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                makeUnexpectedResultBuilder().useActiveException();
            }
            m_testCaseTracker->close();
            handleUnfinishedSections();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            if( testCaseInfo.okToFail() ) {
                std::swap( assertions.failedButOk, assertions.failed );
                m_totals.assertions.failed -= assertions.failedButOk;
                m_totals.assertions.failedButOk += assertions.failedButOk;
            }

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }